

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

array_validator __thiscall goodform::sub_form::array(sub_form *this)

{
  bool bVar1;
  undefined1 *puVar2;
  array_validator aVar3;
  allocator<char> local_51;
  string local_50;
  error_message local_30;
  
  bVar1 = is<std::vector<std::any,std::allocator<std::any>>>(this->variant_);
  if (bVar1) {
    puVar2 = (undefined1 *)
             std::any_cast<std::vector<std::any,std::allocator<std::any>>const&>(this->variant_);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"NOT AN ARRAY",&local_51)
    ;
    error_message::error_message(&local_30,&local_50);
    std::__cxx11::string::operator=((string *)this->error_,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    puVar2 = const_array;
  }
  aVar3.value_ = (vector<std::any,_std::allocator<std::any>_> *)puVar2;
  aVar3.error_ = this->error_;
  return aVar3;
}

Assistant:

array_validator sub_form::array()
  {

    if (!is<goodform::array_t>(this->variant_))
    {
      this->error_ = error_message("NOT AN ARRAY");
      return array_validator(const_array, this->error_);
    }
    else
    {
      return array_validator(get<goodform::array_t>(this->variant_), this->error_);
    }
  }